

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.cpp
# Opt level: O2

size_t duckdb_zstd::HUF_compress_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,uint huffLog
                 ,HUF_nbStreams_e nbStreams,void *workSpace,size_t wkspSize,HUF_CElt *oldHufTable,
                 HUF_repeat *repeat,int flags)

{
  byte bVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  HUF_repeat HVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  uint *count;
  BYTE *pBVar10;
  HUF_CElt *CTable;
  size_t _var_err__;
  bool bVar11;
  uint maxSymbolValue_local;
  HUF_CElt *local_58;
  uint *local_50;
  BYTE *local_48;
  ulong local_40;
  uint maxSymbolValueEnd;
  uint maxSymbolValueBegin;
  
  uVar9 = (ulong)(-(int)workSpace & 7);
  count = (uint *)((long)workSpace + uVar9);
  puVar2 = (uint *)(wkspSize - uVar9);
  if (wkspSize < uVar9) {
    count = (uint *)0x0;
    puVar2 = (uint *)0x0;
  }
  if (puVar2 < (uint *)0x1f08) {
    return 0xffffffffffffffbe;
  }
  if (dstSize == 0 || srcSize == 0) {
    return 0;
  }
  if (0x20000 < srcSize) {
    return 0xffffffffffffffb8;
  }
  if (0xc < huffLog) {
    return 0xffffffffffffffd4;
  }
  if (0xff < maxSymbolValue) {
    return 0xffffffffffffffd2;
  }
  maxSymbolValue_local = maxSymbolValue;
  if (maxSymbolValue == 0) {
    maxSymbolValue_local = 0xff;
  }
  uVar4 = maxSymbolValue_local;
  local_48 = (BYTE *)((long)dst + dstSize);
  uVar3 = 0xb;
  if (huffLog != 0) {
    uVar3 = huffLog;
  }
  bVar11 = (flags & 4U) == 0;
  if ((repeat != (HUF_repeat *)0x0 && !bVar11) && (*repeat == HUF_repeat_valid)) {
    sVar7 = HUF_compressCTable_internal
                      ((BYTE *)dst,(BYTE *)dst,local_48,src,srcSize,nbStreams,oldHufTable,flags);
    return sVar7;
  }
  local_58 = (HUF_CElt *)CONCAT71(local_58._1_7_,repeat == (HUF_repeat *)0x0 || bVar11);
  local_40 = CONCAT44(local_40._4_4_,uVar3);
  if (0x9fff < srcSize && (flags & 8U) != 0) {
    maxSymbolValueBegin = maxSymbolValue_local;
    uVar3 = HIST_count_simple(count,&maxSymbolValueBegin,src,0x1000);
    local_50 = (uint *)(ulong)uVar3;
    maxSymbolValueEnd = uVar4;
    uVar4 = HIST_count_simple(count,&maxSymbolValueEnd,(void *)((long)src + (srcSize - 0x1000)),
                              0x1000);
    if ((ulong)uVar4 + (long)local_50 < 0x45) {
      return 0;
    }
  }
  local_50 = count + 0x302;
  sVar7 = HIST_count_wksp(count,&maxSymbolValue_local,src,srcSize,local_50,0x1000);
  puVar2 = local_50;
  if (0xffffffffffffff88 < sVar7) {
    return sVar7;
  }
  if (sVar7 == srcSize) {
    *(undefined1 *)dst = *src;
    return 1;
  }
  if (sVar7 <= (srcSize >> 7) + 4) {
    return 0;
  }
  pBVar10 = (BYTE *)dst;
  if (repeat != (HUF_repeat *)0x0) {
    HVar6 = *repeat;
    if (HVar6 == HUF_repeat_check) {
      iVar5 = HUF_validateCTable(oldHufTable,count,maxSymbolValue_local);
      if (iVar5 == 0) {
        *repeat = HUF_repeat_none;
        HVar6 = HUF_repeat_none;
        goto LAB_00f5e0db;
      }
      bVar1 = (byte)local_58;
    }
    else {
LAB_00f5e0db:
      bVar1 = (byte)local_58 | HVar6 == HUF_repeat_none;
      local_58 = (HUF_CElt *)CONCAT71(local_58._1_7_,bVar1);
    }
    CTable = oldHufTable;
    if (bVar1 == 0) goto LAB_00f5e0b7;
  }
  local_58 = (HUF_CElt *)(count + 0x100);
  uVar4 = HUF_optimalTableLog((uint)local_40,srcSize,maxSymbolValue_local,puVar2,0x1300,local_58,
                              count,flags);
  sVar7 = HUF_buildCTable_wksp(local_58,count,maxSymbolValue_local,uVar4,puVar2,0x1300);
  CTable = local_58;
  if (0xffffffffffffff88 < sVar7) {
    return sVar7;
  }
  sVar7 = HUF_writeCTable_wksp(dst,dstSize,local_58,maxSymbolValue_local,(uint)sVar7,puVar2,0x2ec);
  uVar4 = maxSymbolValue_local;
  if (0xffffffffffffff88 < sVar7) {
    return sVar7;
  }
  if (repeat == (HUF_repeat *)0x0) {
    if (srcSize <= sVar7 + 0xc) {
      return 0;
    }
  }
  else {
    if (*repeat != HUF_repeat_none) {
      local_40 = HUF_estimateCompressedSize(oldHufTable,count,maxSymbolValue_local);
      sVar8 = HUF_estimateCompressedSize(local_58,count,uVar4);
      CTable = oldHufTable;
      if ((srcSize <= sVar7 + 0xc) || (local_40 <= sVar8 + sVar7)) goto LAB_00f5e0b7;
    }
    if (srcSize <= sVar7 + 0xc) {
      return 0;
    }
    *repeat = HUF_repeat_none;
    CTable = local_58;
  }
  pBVar10 = (BYTE *)(sVar7 + (long)dst);
  if (oldHufTable != (HUF_CElt *)0x0) {
    switchD_00917c1c::default(oldHufTable,CTable,0x808);
  }
LAB_00f5e0b7:
  sVar7 = HUF_compressCTable_internal
                    ((BYTE *)dst,pBVar10,local_48,src,srcSize,nbStreams,CTable,flags);
  return sVar7;
}

Assistant:

static size_t
HUF_compress_internal (void* dst, size_t dstSize,
                 const void* src, size_t srcSize,
                       unsigned maxSymbolValue, unsigned huffLog,
                       HUF_nbStreams_e nbStreams,
                       void* workSpace, size_t wkspSize,
                       HUF_CElt* oldHufTable, HUF_repeat* repeat, int flags)
{
    HUF_compress_tables_t* const table = (HUF_compress_tables_t*)HUF_alignUpWorkspace(workSpace, &wkspSize, ZSTD_ALIGNOF(size_t));
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    DEBUGLOG(5, "HUF_compress_internal (srcSize=%zu)", srcSize);
    HUF_STATIC_ASSERT(sizeof(*table) + HUF_WORKSPACE_MAX_ALIGNMENT <= HUF_WORKSPACE_SIZE);

    /* checks & inits */
    if (wkspSize < sizeof(*table)) return ERROR(workSpace_tooSmall);
    if (!srcSize) return 0;  /* Uncompressed */
    if (!dstSize) return 0;  /* cannot fit anything within dst budget */
    if (srcSize > HUF_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);   /* current block size limit */
    if (huffLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    if (!maxSymbolValue) maxSymbolValue = HUF_SYMBOLVALUE_MAX;
    if (!huffLog) huffLog = HUF_TABLELOG_DEFAULT;

    /* Heuristic : If old table is valid, use it for small inputs */
    if ((flags & HUF_flags_preferRepeat) && repeat && *repeat == HUF_repeat_valid) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, flags);
    }

    /* If uncompressible data is suspected, do a smaller sampling first */
    DEBUG_STATIC_ASSERT(SUSPECT_INCOMPRESSIBLE_SAMPLE_RATIO >= 2);
    if ((flags & HUF_flags_suspectUncompressible) && srcSize >= (SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE * SUSPECT_INCOMPRESSIBLE_SAMPLE_RATIO)) {
        size_t largestTotal = 0;
        DEBUGLOG(5, "input suspected incompressible : sampling to check");
        {   unsigned maxSymbolValueBegin = maxSymbolValue;
            CHECK_V_F(largestBegin, HIST_count_simple (table->count, &maxSymbolValueBegin, (const BYTE*)src, SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) );
            largestTotal += largestBegin;
        }
        {   unsigned maxSymbolValueEnd = maxSymbolValue;
            CHECK_V_F(largestEnd, HIST_count_simple (table->count, &maxSymbolValueEnd, (const BYTE*)src + srcSize - SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE, SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) );
            largestTotal += largestEnd;
        }
        if (largestTotal <= ((2 * SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }

    /* Scan input and build symbol stats */
    {   CHECK_V_F(largest, HIST_count_wksp (table->count, &maxSymbolValue, (const BYTE*)src, srcSize, table->wksps.hist_wksp, sizeof(table->wksps.hist_wksp)) );
        if (largest == srcSize) { *ostart = ((const BYTE*)src)[0]; return 1; }   /* single symbol, rle */
        if (largest <= (srcSize >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }
    DEBUGLOG(6, "histogram detail completed (%zu symbols)", showU32(table->count, maxSymbolValue+1));

    /* Check validity of previous table */
    if ( repeat
      && *repeat == HUF_repeat_check
      && !HUF_validateCTable(oldHufTable, table->count, maxSymbolValue)) {
        *repeat = HUF_repeat_none;
    }
    /* Heuristic : use existing table for small inputs */
    if ((flags & HUF_flags_preferRepeat) && repeat && *repeat != HUF_repeat_none) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, flags);
    }

    /* Build Huffman Tree */
    huffLog = HUF_optimalTableLog(huffLog, srcSize, maxSymbolValue, &table->wksps, sizeof(table->wksps), table->CTable, table->count, flags);
    {   size_t const maxBits = HUF_buildCTable_wksp(table->CTable, table->count,
                                            maxSymbolValue, huffLog,
                                            &table->wksps.buildCTable_wksp, sizeof(table->wksps.buildCTable_wksp));
        CHECK_F(maxBits);
        huffLog = (U32)maxBits;
        DEBUGLOG(6, "bit distribution completed (%zu symbols)", showCTableBits(table->CTable + 1, maxSymbolValue+1));
    }

    /* Write table description header */
    {   CHECK_V_F(hSize, HUF_writeCTable_wksp(op, dstSize, table->CTable, maxSymbolValue, huffLog,
                                              &table->wksps.writeCTable_wksp, sizeof(table->wksps.writeCTable_wksp)) );
        /* Check if using previous huffman table is beneficial */
        if (repeat && *repeat != HUF_repeat_none) {
            size_t const oldSize = HUF_estimateCompressedSize(oldHufTable, table->count, maxSymbolValue);
            size_t const newSize = HUF_estimateCompressedSize(table->CTable, table->count, maxSymbolValue);
            if (oldSize <= hSize + newSize || hSize + 12 >= srcSize) {
                return HUF_compressCTable_internal(ostart, op, oend,
                                                   src, srcSize,
                                                   nbStreams, oldHufTable, flags);
        }   }

        /* Use the new huffman table */
        if (hSize + 12ul >= srcSize) { return 0; }
        op += hSize;
        if (repeat) { *repeat = HUF_repeat_none; }
        if (oldHufTable)
            ZSTD_memcpy(oldHufTable, table->CTable, sizeof(table->CTable));  /* Save new table */
    }
    return HUF_compressCTable_internal(ostart, op, oend,
                                       src, srcSize,
                                       nbStreams, table->CTable, flags);
}